

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

U32 ZSTD_finalizeOffBase(U32 rawOffset,U32 *rep,U32 ll0)

{
  int in_EDX;
  int *in_RSI;
  int in_EDI;
  U32 offBase;
  U32 local_18;
  
  if (in_EDI == 0) {
    __assert_fail("(rawOffset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x69a3,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
  }
  local_18 = in_EDI + 3;
  if ((in_EDX == 0) && (in_EDI == *in_RSI)) {
    local_18 = 1;
  }
  else if (in_EDI == in_RSI[1]) {
    if (in_EDX == 2) {
      __assert_fail("(2 - ll0)>=1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x69a8,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    if (3 < 2U - in_EDX) {
      __assert_fail("(2 - ll0)<=ZSTD_REP_NUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x69a8,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    local_18 = 2 - in_EDX;
  }
  else if (in_EDI == in_RSI[2]) {
    if (in_EDX == 3) {
      __assert_fail("(3 - ll0)>=1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x69aa,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    if (3 < 3U - in_EDX) {
      __assert_fail("(3 - ll0)<=ZSTD_REP_NUM",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x69aa,"U32 ZSTD_finalizeOffBase(U32, const U32 *, U32)");
    }
    local_18 = 3 - in_EDX;
  }
  else if ((in_EDX != 0) && (in_EDI == *in_RSI + -1)) {
    local_18 = 3;
  }
  return local_18;
}

Assistant:

static U32 ZSTD_finalizeOffBase(U32 rawOffset, const U32 rep[ZSTD_REP_NUM], U32 ll0)
{
    U32 offBase = OFFSET_TO_OFFBASE(rawOffset);

    if (!ll0 && rawOffset == rep[0]) {
        offBase = REPCODE1_TO_OFFBASE;
    } else if (rawOffset == rep[1]) {
        offBase = REPCODE_TO_OFFBASE(2 - ll0);
    } else if (rawOffset == rep[2]) {
        offBase = REPCODE_TO_OFFBASE(3 - ll0);
    } else if (ll0 && rawOffset == rep[0] - 1) {
        offBase = REPCODE3_TO_OFFBASE;
    }
    return offBase;
}